

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O1

HighsDebugStatus
debugAnalysePrimalDualErrors(HighsOptions *options,HighsPrimalDualErrors *primal_dual_errors)

{
  double dVar1;
  int iVar2;
  HighsLogType HVar3;
  HighsLogType HVar4;
  HighsDebugStatus HVar5;
  string value_adjective;
  undefined1 *local_50;
  char *local_48;
  undefined1 local_40 [16];
  
  local_48 = (char *)0x0;
  local_40[0] = 0;
  iVar2 = (options->super_HighsOptionsStruct).highs_debug_level;
  local_50 = local_40;
  if (primal_dual_errors->num_nonzero_basic_duals < 0) {
    HVar5 = kOk;
  }
  else {
    if (primal_dual_errors->num_nonzero_basic_duals == 0) {
      HVar4 = kVerbose;
      HVar5 = kOk;
      std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,0x3d2f67);
    }
    else {
      std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,0x3e1094);
      HVar4 = kError;
      HVar5 = kLogicalError;
    }
    HVar3 = kInfo;
    if (iVar2 < 2) {
      HVar3 = HVar4;
    }
    highsLogDev(&(options->super_HighsOptionsStruct).log_options,HVar3,
                "PrDuErrors : %-9s Nonzero basic duals:       num = %7d; max = %9.4g; sum = %9.4g\n"
                ,primal_dual_errors->max_nonzero_basic_dual,
                primal_dual_errors->sum_nonzero_basic_duals,local_50,
                (ulong)(uint)primal_dual_errors->num_nonzero_basic_duals);
  }
  if (-1 < primal_dual_errors->num_off_bound_nonbasic) {
    if (primal_dual_errors->num_off_bound_nonbasic == 0) {
      HVar4 = kVerbose;
      HVar5 = kOk;
      std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x3d2f67);
    }
    else {
      std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x3e1094);
      HVar4 = kError;
      HVar5 = kLogicalError;
    }
    HVar3 = kInfo;
    if (iVar2 < 2) {
      HVar3 = HVar4;
    }
    highsLogDev(&(options->super_HighsOptionsStruct).log_options,HVar3,
                "PrDuErrors : %-9s Off-bound nonbasic values: num = %7d; max = %9.4g; sum = %9.4g\n"
                ,primal_dual_errors->max_off_bound_nonbasic,
                primal_dual_errors->sum_off_bound_nonbasic,local_50,
                (ulong)(uint)primal_dual_errors->num_off_bound_nonbasic);
  }
  if (-1 < primal_dual_errors->num_primal_residual) {
    dVar1 = (primal_dual_errors->max_primal_residual).absolute_value;
    if (dVar1 <= excessive_residual_error) {
      if (dVar1 <= 1e-12) {
        HVar4 = kVerbose;
        HVar5 = kOk;
        std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x3d2f67);
      }
      else {
        HVar5 = kWarning;
        std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x3d3bc7);
        HVar4 = kDetailed;
      }
    }
    else {
      std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x3d3bbd);
      HVar4 = kError;
      HVar5 = kError;
    }
    HVar3 = kInfo;
    if (iVar2 < 2) {
      HVar3 = HVar4;
    }
    highsLogDev(&(options->super_HighsOptionsStruct).log_options,HVar3,
                "PrDuErrors : %-9s Primal residual:           num = %7d; max = %9.4g; sum = %9.4g\n"
                ,(primal_dual_errors->max_primal_residual).absolute_value,
                primal_dual_errors->sum_primal_residual,local_50,
                (ulong)(uint)primal_dual_errors->num_primal_residual);
  }
  if (-1 < primal_dual_errors->num_dual_residual) {
    dVar1 = (primal_dual_errors->max_dual_residual).absolute_value;
    if (dVar1 <= excessive_residual_error) {
      if (dVar1 <= 1e-12) {
        HVar4 = kVerbose;
        HVar5 = kOk;
        std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x3d2f67);
      }
      else {
        HVar5 = kWarning;
        std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x3d3bc7);
        HVar4 = kDetailed;
      }
    }
    else {
      std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x3d3bbd);
      HVar4 = kError;
      HVar5 = kError;
    }
    HVar3 = kInfo;
    if (iVar2 < 2) {
      HVar3 = HVar4;
    }
    highsLogDev(&(options->super_HighsOptionsStruct).log_options,HVar3,
                "PrDuErrors : %-9s Dual residual:             num = %7d; max = %9.4g; sum = %9.4g\n"
                ,(primal_dual_errors->max_dual_residual).absolute_value,
                primal_dual_errors->sum_dual_residual,local_50,
                (ulong)(uint)primal_dual_errors->num_dual_residual);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return HVar5;
}

Assistant:

HighsDebugStatus debugAnalysePrimalDualErrors(
    const HighsOptions& options, HighsPrimalDualErrors& primal_dual_errors) {
  std::string value_adjective;
  HighsLogType report_level;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  const bool force_report = options.highs_debug_level >= kHighsDebugLevelCostly;
  if (primal_dual_errors.num_nonzero_basic_duals >= 0) {
    if (primal_dual_errors.num_nonzero_basic_duals > 0) {
      value_adjective = "Error";
      report_level = HighsLogType::kError;
      return_status = HighsDebugStatus::kLogicalError;
    } else {
      value_adjective = "";
      report_level = HighsLogType::kVerbose;
      return_status = HighsDebugStatus::kOk;
    }
    if (force_report) report_level = HighsLogType::kInfo;
    highsLogDev(
        options.log_options, report_level,
        "PrDuErrors : %-9s Nonzero basic duals:       num = %7" HIGHSINT_FORMAT
        "; "
        "max = %9.4g; sum = %9.4g\n",
        value_adjective.c_str(), primal_dual_errors.num_nonzero_basic_duals,
        primal_dual_errors.max_nonzero_basic_dual,
        primal_dual_errors.sum_nonzero_basic_duals);
  }
  if (primal_dual_errors.num_off_bound_nonbasic >= 0) {
    if (primal_dual_errors.num_off_bound_nonbasic > 0) {
      value_adjective = "Error";
      report_level = HighsLogType::kError;
      return_status = HighsDebugStatus::kLogicalError;
    } else {
      value_adjective = "";
      report_level = HighsLogType::kVerbose;
      return_status = HighsDebugStatus::kOk;
    }
    if (force_report) report_level = HighsLogType::kInfo;
    highsLogDev(
        options.log_options, report_level,
        "PrDuErrors : %-9s Off-bound nonbasic values: num = %7" HIGHSINT_FORMAT
        "; "
        "max = %9.4g; sum = %9.4g\n",
        value_adjective.c_str(), primal_dual_errors.num_off_bound_nonbasic,
        primal_dual_errors.max_off_bound_nonbasic,
        primal_dual_errors.sum_off_bound_nonbasic);
  }
  if (primal_dual_errors.num_primal_residual >= 0) {
    if (primal_dual_errors.max_primal_residual.absolute_value >
        excessive_residual_error) {
      value_adjective = "Excessive";
      report_level = HighsLogType::kError;
      return_status = HighsDebugStatus::kError;
    } else if (primal_dual_errors.max_primal_residual.absolute_value >
               large_residual_error) {
      value_adjective = "Large";
      report_level = HighsLogType::kDetailed;
      return_status = HighsDebugStatus::kWarning;
    } else {
      value_adjective = "";
      report_level = HighsLogType::kVerbose;
      return_status = HighsDebugStatus::kOk;
    }
    if (force_report) report_level = HighsLogType::kInfo;
    highsLogDev(
        options.log_options, report_level,
        "PrDuErrors : %-9s Primal residual:           num = %7" HIGHSINT_FORMAT
        "; "
        "max = %9.4g; sum = %9.4g\n",
        value_adjective.c_str(), primal_dual_errors.num_primal_residual,
        primal_dual_errors.max_primal_residual.absolute_value,
        primal_dual_errors.sum_primal_residual);
  }
  if (primal_dual_errors.num_dual_residual >= 0) {
    if (primal_dual_errors.max_dual_residual.absolute_value >
        excessive_residual_error) {
      value_adjective = "Excessive";
      report_level = HighsLogType::kError;
      return_status = HighsDebugStatus::kError;
    } else if (primal_dual_errors.max_dual_residual.absolute_value >
               large_residual_error) {
      value_adjective = "Large";
      report_level = HighsLogType::kDetailed;
      return_status = HighsDebugStatus::kWarning;
    } else {
      value_adjective = "";
      report_level = HighsLogType::kVerbose;
      return_status = HighsDebugStatus::kOk;
    }
    if (force_report) report_level = HighsLogType::kInfo;
    highsLogDev(
        options.log_options, report_level,
        "PrDuErrors : %-9s Dual residual:             num = %7" HIGHSINT_FORMAT
        "; "
        "max = %9.4g; sum = %9.4g\n",
        value_adjective.c_str(), primal_dual_errors.num_dual_residual,
        primal_dual_errors.max_dual_residual.absolute_value,
        primal_dual_errors.sum_dual_residual);
  }
  return return_status;
}